

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flyweight.cpp
# Opt level: O1

string * __thiscall User::get_item_abi_cxx11_(string *__return_storage_ptr__,User *this,key k)

{
  long lVar1;
  iterator iVar2;
  runtime_error *this_00;
  long *plVar3;
  long *plVar4;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  local_80 = (long *)CONCAT44(local_80._4_4_,(uint)this);
  iVar2 = boost::multi_index::detail::
          ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_int,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::basic_string<char>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_int>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
          ::find<unsigned_int>
                    ((ordered_index_impl<boost::multi_index::member<boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_true>,_unsigned_int,_&boost::bimaps::relation::detail::relation_storage<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::basic_string<char>,_boost::bimaps::relation::member_at::right>,_true>::left>,_std::less<unsigned_int>,_boost::multi_index::detail::nth_layer<2,_boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_boost::bimaps::detail::bimap_core<unsigned_int,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mpl_::na,_mpl_::na,_mpl_::na>::core_indices,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>,_boost::mpl::v_item<boost::bimaps::relation::member_at::left,_boost::mpl::vector0<mpl_::na>,_0>,_boost::multi_index::detail::ordered_unique_tag,_boost::multi_index::detail::null_augment_policy>
                      *)name_storage_abi_cxx11_.left.super_map_adaptor<_da42dc72_>.
                        super_ordered_associative_container_adaptor<_8fe5953d_>.super_type.
                        super_type.dwfb.data,(uint *)&local_80);
  if (iVar2.node !=
      *(ordered_index_node<boost::multi_index::detail::null_augment_policy,_boost::multi_index::detail::index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>_>
        **)((long)name_storage_abi_cxx11_.left.super_map_adaptor<_da42dc72_>.
                  super_ordered_associative_container_adaptor<_8fe5953d_>.super_type.super_type.dwfb
                  .data + -8)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    lVar1 = *(long *)((long)&((iVar2.node)->
                             super_index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                             ).
                             super_pod_value_holder<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                             .space.data_ + 8);
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,lVar1,
               *(long *)((long)&((iVar2.node)->
                                super_index_node_base<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>,_std::allocator<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>_>
                                ).
                                super_pod_value_holder<boost::bimaps::relation::mutant_relation<boost::bimaps::tags::tagged<const_unsigned_int,_boost::bimaps::relation::member_at::left>,_boost::bimaps::tags::tagged<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_boost::bimaps::relation::member_at::right>,_mpl_::na,_true>_>
                                .space.data_ + 0x10) + lVar1);
    return __return_storage_ptr__;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::__cxx11::to_string(&local_60,(uint)this);
  std::operator+(&local_40,"Key ",&local_60);
  plVar3 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar3;
  plVar4 = plVar3 + 2;
  if (local_80 == plVar4) {
    local_70 = *plVar4;
    lStack_68 = plVar3[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar4;
  }
  local_78 = plVar3[1];
  *plVar3 = (long)plVar4;
  plVar3[1] = 0;
  *(undefined1 *)(plVar3 + 2) = 0;
  std::runtime_error::runtime_error(this_00,(string *)&local_80);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

static std::string get_item(key k)
	{
		auto it{name_storage.left.find(k)};
		if(it == name_storage.left.end())
		{
			throw std::runtime_error{"Key " + std::to_string(k) + " not in name storage"};
		}

		return it->second;
	}